

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_ManMarkTfi_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_ManMarkTfi_rec(p,pGVar2);
      pGVar2 = Gia_ObjFanin1(pObj);
      Gia_ManMarkTfi_rec(p,pGVar2);
    }
  }
  return;
}

Assistant:

void Gia_ManMarkTfi_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Gia_ManMarkTfi_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ManMarkTfi_rec( p, Gia_ObjFanin1(pObj) );
}